

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpunsafe.c
# Opt level: O2

mp_int * mp_unsafe_copy(mp_int *x)

{
  size_t nw;
  mp_int *dest;
  
  nw = mp_unsafe_words_needed(x);
  dest = mp_make_sized(nw);
  mp_copy_into(dest,x);
  return dest;
}

Assistant:

mp_int *mp_unsafe_copy(mp_int *x)
{
    mp_int *copy = mp_make_sized(mp_unsafe_words_needed(x));
    mp_copy_into(copy, x);
    return copy;
}